

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::ClipControlFaceCulling::iterate(ClipControlFaceCulling *this)

{
  code *pcVar1;
  TestContext *this_00;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  qpTestResult qVar5;
  TestLog *log_00;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  ShaderProgram *pSVar8;
  char *pcVar9;
  TestError *this_01;
  ulong uStack_1e0;
  qpTestResult loopResult;
  size_t orig;
  qpTestResult result;
  GLenum origins [2];
  float vertex_data0 [24];
  string local_160;
  allocator<char> local_13d [13];
  string local_130;
  ProgramSources local_110;
  undefined1 local_40 [8];
  SharedPtr<glu::ShaderProgram> program;
  ClipControlApi cc;
  Functions *gl;
  TestLog *log;
  ClipControlFaceCulling *this_local;
  long lVar7;
  
  log_00 = tcu::TestContext::getLog
                     ((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.
                      super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  pRVar6 = deqp::Context::getRenderContext
                     ((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.
                      super_TestCase.m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  ClipControlApi::ClipControlApi
            ((ClipControlApi *)&program.m_state,
             (this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
             m_context,(this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.m_api);
  (**(code **)(lVar7 + 0x5e0))(0xb44);
  pSVar8 = (ShaderProgram *)operator_new(0xd0);
  vertex_data0[0x17]._2_1_ = 1;
  pRVar6 = deqp::Context::getRenderContext
                     ((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.
                      super_TestCase.m_context);
  pcVar9 = vsh(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,pcVar9,local_13d);
  pcVar9 = ClipControlRenderBaseTest::fsh(&this->super_ClipControlRenderBaseTest);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,pcVar9,(allocator<char> *)((long)vertex_data0 + 0x5f));
  glu::makeVtxFragSources(&local_110,&local_130,&local_160);
  glu::ShaderProgram::ShaderProgram(pSVar8,pRVar6,&local_110);
  vertex_data0[0x17]._2_1_ = 0;
  de::SharedPtr<glu::ShaderProgram>::SharedPtr((SharedPtr<glu::ShaderProgram> *)local_40,pSVar8);
  glu::ProgramSources::~ProgramSources(&local_110);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)((long)vertex_data0 + 0x5f));
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(local_13d);
  pSVar8 = de::SharedPtr<glu::ShaderProgram>::operator*((SharedPtr<glu::ShaderProgram> *)local_40);
  glu::operator<<(log_00,pSVar8);
  pSVar8 = de::SharedPtr<glu::ShaderProgram>::operator->((SharedPtr<glu::ShaderProgram> *)local_40);
  bVar2 = glu::ShaderProgram::isOk(pSVar8);
  if (!bVar2) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Program compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cClipControlTests.cpp"
               ,0x3f1);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lVar7 + 0x708))(1,&this->m_vao);
  (**(code **)(lVar7 + 0xd8))(this->m_vao);
  (**(code **)(lVar7 + 0x6c8))(1,&this->m_vbo);
  vertex_data0[0x12] = 0.0;
  vertex_data0[0x13] = 1.0;
  vertex_data0[0x14] = 1.0;
  vertex_data0[0x15] = 1.0;
  vertex_data0[0xe] = 1.0;
  vertex_data0[0xf] = -1.0;
  vertex_data0[0x10] = 1.0;
  vertex_data0[0x11] = -1.0;
  vertex_data0[10] = 0.0;
  vertex_data0[0xb] = -1.0;
  vertex_data0[0xc] = 0.0;
  vertex_data0[0xd] = 1.0;
  vertex_data0[6] = 0.0;
  vertex_data0[7] = 1.0;
  vertex_data0[8] = -1.0;
  vertex_data0[9] = 1.0;
  vertex_data0[2] = -1.0;
  vertex_data0[3] = 1.0;
  vertex_data0[4] = 0.0;
  vertex_data0[5] = -1.0;
  origins[0] = 0xbf800000;
  origins[1] = 0xbf800000;
  vertex_data0[0] = 0.0;
  vertex_data0[1] = -1.0;
  (**(code **)(lVar7 + 0x40))(0x8892,this->m_vbo);
  (**(code **)(lVar7 + 0x150))(0x8892,0x60,origins,0x88e4);
  (**(code **)(lVar7 + 0x19f0))(0,2,0x1406,0,0,0);
  (**(code **)(lVar7 + 0x610))(0);
  pcVar1 = *(code **)(lVar7 + 0x1680);
  pSVar8 = de::SharedPtr<glu::ShaderProgram>::operator->((SharedPtr<glu::ShaderProgram> *)local_40);
  dVar4 = glu::ShaderProgram::getProgram(pSVar8);
  (*pcVar1)(dVar4);
  orig._4_4_ = QP_TEST_RESULT_PASS;
  for (uStack_1e0 = 0; uStack_1e0 < 2; uStack_1e0 = uStack_1e0 + 1) {
    (**(code **)(lVar7 + 0x1c0))(0x3f800000,0);
    (**(code **)(lVar7 + 0x188))(0x4000);
    (**(code **)(lVar7 + 0x538))(4,0,0xc);
    (*(code *)program.m_state)(vertex_data0[uStack_1e0 - 4],0x935e);
    dVar4 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar4,"ClipControl()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cClipControlTests.cpp"
                    ,0x416);
    qVar5 = ValidateFramebuffer(this,(this->super_ClipControlRenderBaseTest).
                                     super_ClipControlBaseTest.super_TestCase.m_context);
    if (qVar5 != QP_TEST_RESULT_PASS) {
      orig._4_4_ = qVar5;
    }
  }
  this_00 = (this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
            super_TestCase.super_TestNode.m_testCtx;
  pcVar9 = qpGetTestResultName(orig._4_4_);
  tcu::TestContext::setTestResult(this_00,orig._4_4_,pcVar9);
  de::SharedPtr<glu::ShaderProgram>::~SharedPtr((SharedPtr<glu::ShaderProgram> *)local_40);
  return STOP;
}

Assistant:

IterateResult iterate()
	{

		tcu::TestLog&		  log = m_testCtx.getLog();
		const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
		ClipControlApi		  cc(m_context, m_api);

		//Enable GL_CULL_FACE, leave default front face & cull face(CCW, BACK)
		gl.enable(GL_CULL_FACE);

		//Render a counter-clockwise triangles covering
		//(-1.0, -1.0) to(0.0, 1.0) and write a pixel value of green(0, 1, 0).
		//Render a clockwise triangles covering
		//(0.0, -1.0) to(1.0, 1.0) and write a pixel value of green(0, 1, 0).
		de::SharedPtr<glu::ShaderProgram> program(
			new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vsh(), fsh())));

		log << (*program);
		if (!program->isOk())
		{
			TCU_FAIL("Program compilation failed");
		}

		gl.genVertexArrays(1, &m_vao);
		gl.bindVertexArray(m_vao);

		gl.genBuffers(1, &m_vbo);

		const float vertex_data0[] = {
			//CCW
			-1.0, -1.0, 0.0, -1.0, -1.0, 1.0, 0.0, -1.0, 0.0, 1.0, -1.0, 1.0,
			//CW
			0.0, -1.0, 0.0, 1.0, 1.0, -1.0, 1.0, -1.0, 0.0, 1.0, 1.0, 1.0,
		};

		gl.bindBuffer(GL_ARRAY_BUFFER, m_vbo);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(vertex_data0), vertex_data0, GL_STATIC_DRAW);

		gl.vertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, 0);
		gl.enableVertexAttribArray(0);

		gl.useProgram(program->getProgram());

		glw::GLenum origins[] = { GL_UPPER_LEFT, GL_LOWER_LEFT };

		qpTestResult result = QP_TEST_RESULT_PASS;

		for (size_t orig = 0; orig < DE_LENGTH_OF_ARRAY(origins); orig++)
		{
			//Clear the framebuffer to red (1,0,0).
			gl.clearColor(1.0, 0.0, 0.0, 1.0);
			gl.clear(GL_COLOR_BUFFER_BIT);

			gl.drawArrays(GL_TRIANGLES, 0, 12);

			//Set ClipControl(<origin>, NEGATIVE_ONE_TO_ONE)
			cc.clipControl(origins[orig], GL_NEGATIVE_ONE_TO_ONE);
			GLU_EXPECT_NO_ERROR(gl.getError(), "ClipControl()");

			//Read back the framebuffer with ReadPixels
			//Verify the green pixels at the left and red at the right.
			qpTestResult loopResult = ValidateFramebuffer(m_context);
			if (loopResult != QP_TEST_RESULT_PASS)
			{
				result = loopResult;
			}
		}
		m_testCtx.setTestResult(result, qpGetTestResultName(result));

		return STOP;
	}